

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O3

void dradbg(int ido,int ip,int l1,int idl1,float *cc,float *c1,float *c2,float *ch,float *ch2,
           float *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  float *pfVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  float *pfVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  int local_68;
  int local_4c;
  int local_48;
  int local_44;
  
  iVar1 = ip * ido;
  dVar22 = cos((double)(6.2831855 / (float)ip));
  dVar23 = sin((double)(6.2831855 / (float)ip));
  iVar2 = ip + 1 >> 1;
  if (ido < l1) {
    if (0 < ido) {
      uVar11 = 0;
      pfVar6 = ch;
      pfVar13 = cc;
      iVar14 = l1;
      pfVar9 = cc;
      pfVar20 = ch;
      do {
        do {
          *pfVar6 = *pfVar13;
          iVar14 = iVar14 + -1;
          pfVar6 = pfVar6 + (uint)ido;
          pfVar13 = pfVar13 + iVar1;
        } while (iVar14 != 0);
        uVar11 = uVar11 + 1;
        pfVar13 = pfVar9 + 1;
        pfVar6 = pfVar20 + 1;
        iVar14 = l1;
        pfVar9 = pfVar13;
        pfVar20 = pfVar6;
      } while (uVar11 != (uint)ido);
    }
  }
  else if (0 < l1) {
    iVar14 = 0;
    pfVar6 = ch;
    pfVar13 = cc;
    do {
      lVar4 = 0;
      do {
        pfVar6[lVar4] = pfVar13[lVar4];
        lVar4 = lVar4 + 1;
      } while (ido != (int)lVar4);
      iVar14 = iVar14 + 1;
      pfVar13 = pfVar13 + iVar1;
      pfVar6 = pfVar6 + ido;
    } while (iVar14 != l1);
  }
  iVar3 = l1 * ido;
  iVar14 = ido * 2;
  if (1 < iVar2) {
    iVar10 = (ip + -1) * iVar3;
    pfVar6 = cc + iVar14;
    iVar12 = 1;
    iVar15 = iVar3;
    do {
      if (0 < l1) {
        pfVar13 = ch;
        pfVar9 = pfVar6;
        iVar7 = l1;
        do {
          pfVar13[iVar15] = pfVar9[-1] + pfVar9[-1];
          pfVar13[iVar10] = *pfVar9 + *pfVar9;
          pfVar13 = pfVar13 + ido;
          pfVar9 = pfVar9 + iVar1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      iVar12 = iVar12 + 1;
      iVar15 = iVar15 + iVar3;
      iVar10 = iVar10 - iVar3;
      pfVar6 = pfVar6 + iVar14;
    } while (iVar12 != iVar2);
  }
  iVar15 = ido + -1 >> 1;
  if (ido != 1) {
    if (iVar15 < l1) {
      if (iVar2 < 2) goto LAB_001de899;
      local_68 = iVar14 + -2;
      local_44 = iVar14 + 2;
      local_48 = (ip + -1) * iVar3 + 2;
      local_4c = iVar3 + 2;
      iVar10 = 1;
      do {
        if (2 < ido) {
          iVar19 = 2;
          iVar12 = local_48;
          iVar7 = local_68;
          iVar8 = local_4c;
          iVar5 = local_44;
          do {
            if (0 < l1) {
              pfVar6 = ch;
              pfVar13 = cc;
              iVar17 = l1;
              do {
                pfVar6[(long)iVar8 + -1] = pfVar13[(long)iVar5 + -1] + pfVar13[(long)iVar7 + -1];
                pfVar6[(long)iVar12 + -1] = pfVar13[(long)iVar5 + -1] - pfVar13[(long)iVar7 + -1];
                pfVar6[iVar8] = pfVar13[iVar5] - pfVar13[iVar7];
                pfVar6[iVar12] = pfVar13[iVar5] + pfVar13[iVar7];
                pfVar6 = pfVar6 + ido;
                pfVar13 = pfVar13 + iVar1;
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
            }
            iVar19 = iVar19 + 2;
            iVar7 = iVar7 + -2;
            iVar5 = iVar5 + 2;
            iVar12 = iVar12 + 2;
            iVar8 = iVar8 + 2;
          } while (iVar19 < ido);
        }
        iVar10 = iVar10 + 1;
        local_68 = local_68 + iVar14;
        local_44 = local_44 + iVar14;
        local_48 = local_48 - iVar3;
        local_4c = local_4c + iVar3;
      } while (iVar10 != iVar2);
    }
    else {
      if (iVar2 < 2) goto LAB_001de899;
      iVar7 = (ip + -1) * iVar3;
      iVar8 = 1;
      iVar10 = iVar3;
      iVar12 = iVar14;
      do {
        if (0 < l1) {
          pfVar6 = ch + (long)iVar10 + 2;
          pfVar13 = ch + (long)iVar7 + 2;
          pfVar9 = cc + iVar12;
          iVar5 = 0;
          do {
            if (2 < ido) {
              lVar21 = -2;
              lVar4 = 0;
              do {
                pfVar6[lVar4 + -1] = pfVar9[lVar4 + 1] + pfVar9[lVar21 + -1];
                pfVar13[lVar4 + -1] = pfVar9[lVar4 + 1] - pfVar9[lVar21 + -1];
                pfVar6[lVar4] = pfVar9[lVar4 + 2] - pfVar9[lVar21];
                pfVar13[lVar4] = pfVar9[lVar4 + 2] + pfVar9[lVar21];
                lVar21 = lVar21 + -2;
                iVar19 = (int)lVar4;
                lVar4 = lVar4 + 2;
              } while (iVar19 + 4 < ido);
            }
            iVar5 = iVar5 + 1;
            pfVar6 = pfVar6 + ido;
            pfVar13 = pfVar13 + ido;
            pfVar9 = pfVar9 + iVar1;
          } while (iVar5 != l1);
        }
        iVar8 = iVar8 + 1;
        iVar12 = iVar12 + iVar14;
        iVar7 = iVar7 - iVar3;
        iVar10 = iVar10 + iVar3;
      } while (iVar8 != iVar2);
    }
  }
  iVar1 = ip + -1;
  if (1 < iVar2) {
    iVar10 = iVar1 * idl1;
    lVar4 = (long)iVar10;
    fVar24 = 0.0;
    iVar12 = 1;
    fVar26 = 1.0;
    iVar14 = idl1;
    do {
      fVar25 = (float)dVar22 * fVar26 - (float)dVar23 * fVar24;
      fVar24 = fVar24 * (float)dVar22 + fVar26 * (float)dVar23;
      if (0 < idl1) {
        uVar11 = 0;
        do {
          c2[(long)iVar14 + uVar11] = ch2[(long)idl1 + uVar11] * fVar25 + ch2[uVar11];
          c2[(long)iVar10 + uVar11] = ch2[lVar4 + uVar11] * fVar24;
          uVar11 = uVar11 + 1;
        } while ((uint)idl1 != uVar11);
      }
      if (iVar2 != 2) {
        iVar5 = 2;
        fVar26 = fVar24;
        fVar27 = fVar25;
        iVar7 = (ip + -2) * idl1;
        iVar8 = idl1 * 2;
        do {
          fVar28 = fVar25 * fVar27 + fVar26 * -fVar24;
          fVar26 = fVar27 * fVar24 + fVar25 * fVar26;
          if (0 < idl1) {
            lVar21 = 0;
            do {
              c2[iVar14 + lVar21] = ch2[iVar8 + lVar21] * fVar28 + c2[iVar14 + lVar21];
              c2[iVar10 + lVar21] = ch2[iVar7 + lVar21] * fVar26 + c2[iVar10 + lVar21];
              lVar21 = lVar21 + 1;
            } while (idl1 != (int)lVar21);
          }
          iVar5 = iVar5 + 1;
          iVar7 = iVar7 - idl1;
          iVar8 = iVar8 + idl1;
          fVar27 = fVar28;
        } while (iVar5 != iVar2);
      }
      iVar12 = iVar12 + 1;
      iVar10 = iVar10 - idl1;
      iVar14 = iVar14 + idl1;
      fVar26 = fVar25;
    } while (iVar12 != iVar2);
    if (1 < iVar2) {
      iVar10 = 1;
      iVar14 = idl1;
      do {
        if (0 < idl1) {
          uVar11 = 0;
          do {
            ch2[uVar11] = ch2[(long)iVar14 + uVar11] + ch2[uVar11];
            uVar11 = uVar11 + 1;
          } while ((uint)idl1 != uVar11);
        }
        iVar10 = iVar10 + 1;
        iVar14 = iVar14 + idl1;
      } while (iVar10 != iVar2);
      if (1 < iVar2) {
        iVar10 = iVar3 * iVar1;
        iVar12 = 1;
        iVar14 = iVar3;
        do {
          if (0 < l1) {
            lVar21 = (long)iVar10;
            lVar16 = (long)iVar14;
            lVar4 = 0;
            iVar7 = l1;
            do {
              *(float *)((long)ch + lVar4 + lVar16 * 4) =
                   *(float *)((long)c1 + lVar4 + lVar16 * 4) -
                   *(float *)((long)c1 + lVar4 + lVar21 * 4);
              *(float *)((long)ch + lVar4 + lVar21 * 4) =
                   *(float *)((long)c1 + lVar4 + lVar16 * 4) +
                   *(float *)((long)c1 + lVar4 + lVar21 * 4);
              lVar4 = lVar4 + (long)ido * 4;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
          iVar12 = iVar12 + 1;
          iVar14 = iVar14 + iVar3;
          iVar10 = iVar10 - iVar3;
        } while (iVar12 != iVar2);
      }
    }
  }
  if (ido == 1) {
    return;
  }
  if (iVar15 < l1) {
    if (1 < iVar2) {
      iVar14 = iVar1 * iVar3 + 2;
      iVar1 = iVar3 + 2;
      iVar10 = 1;
      do {
        if (2 < ido) {
          iVar8 = 2;
          iVar7 = iVar14;
          iVar12 = iVar1;
          do {
            if (0 < l1) {
              lVar21 = (long)iVar12;
              lVar4 = (long)iVar7;
              lVar16 = 0;
              iVar5 = l1;
              do {
                *(float *)((long)ch + lVar16 + lVar21 * 4 + -4) =
                     *(float *)((long)c1 + lVar16 + lVar21 * 4 + -4) -
                     *(float *)((long)c1 + lVar16 + lVar4 * 4);
                *(float *)((long)ch + lVar16 + lVar4 * 4 + -4) =
                     *(float *)((long)c1 + lVar16 + lVar21 * 4 + -4) +
                     *(float *)((long)c1 + lVar16 + lVar4 * 4);
                *(float *)((long)ch + lVar16 + lVar21 * 4) =
                     *(float *)((long)c1 + lVar16 + lVar21 * 4) +
                     *(float *)((long)c1 + lVar16 + lVar4 * 4 + -4);
                *(float *)((long)ch + lVar16 + lVar4 * 4) =
                     *(float *)((long)c1 + lVar16 + lVar21 * 4) -
                     *(float *)((long)c1 + lVar16 + lVar4 * 4 + -4);
                lVar16 = lVar16 + (long)ido * 4;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            iVar8 = iVar8 + 2;
            iVar7 = iVar7 + 2;
            iVar12 = iVar12 + 2;
          } while (iVar8 < ido);
        }
        iVar10 = iVar10 + 1;
        iVar14 = iVar14 - iVar3;
        iVar1 = iVar1 + iVar3;
      } while (iVar10 != iVar2);
    }
  }
  else if (1 < iVar2) {
    iVar1 = iVar1 * iVar3;
    iVar10 = 1;
    iVar14 = iVar3;
    do {
      if (0 < l1) {
        pfVar6 = c1 + (long)iVar14 + 2;
        pfVar13 = ch + (long)iVar14 + 2;
        pfVar9 = ch + (long)iVar1 + 2;
        pfVar20 = c1 + (long)iVar1 + 2;
        iVar12 = 0;
        do {
          if (2 < ido) {
            lVar4 = 0;
            do {
              pfVar13[lVar4 + -1] = pfVar6[lVar4 + -1] - pfVar20[lVar4];
              pfVar9[lVar4 + -1] = pfVar6[lVar4 + -1] + pfVar20[lVar4];
              pfVar13[lVar4] = pfVar6[lVar4] + pfVar20[lVar4 + -1];
              pfVar9[lVar4] = pfVar6[lVar4] - pfVar20[lVar4 + -1];
              iVar7 = (int)lVar4;
              lVar4 = lVar4 + 2;
            } while (iVar7 + 4 < ido);
          }
          iVar12 = iVar12 + 1;
          pfVar6 = pfVar6 + ido;
          pfVar13 = pfVar13 + ido;
          pfVar9 = pfVar9 + ido;
          pfVar20 = pfVar20 + ido;
        } while (iVar12 != l1);
      }
      iVar10 = iVar10 + 1;
      iVar1 = iVar1 - iVar3;
      iVar14 = iVar14 + iVar3;
    } while (iVar10 != iVar2);
  }
LAB_001de899:
  if (0 < idl1) {
    uVar11 = 0;
    do {
      c2[uVar11] = ch2[uVar11];
      uVar11 = uVar11 + 1;
    } while ((uint)idl1 != uVar11);
  }
  if (1 < ip) {
    lVar4 = (long)ido;
    iVar2 = 1;
    iVar1 = iVar3;
    do {
      if (0 < l1) {
        lVar21 = (long)iVar1 << 2;
        iVar14 = l1;
        do {
          *(undefined4 *)((long)c1 + lVar21) = *(undefined4 *)((long)ch + lVar21);
          lVar21 = lVar21 + lVar4 * 4;
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      iVar2 = iVar2 + 1;
      iVar1 = iVar1 + iVar3;
    } while (iVar2 != ip);
    if (l1 < iVar15) {
      if (1 < ip) {
        iVar2 = 1;
        iVar14 = -1;
        iVar1 = iVar3;
        do {
          if (0 < l1) {
            pfVar6 = ch + iVar1;
            pfVar13 = c1 + iVar1;
            iVar15 = 0;
            do {
              if (2 < ido) {
                lVar21 = 2;
                do {
                  pfVar13[lVar21 + -1] =
                       wa[(long)iVar14 + lVar21 + -1] * pfVar6[lVar21 + -1] -
                       pfVar6[lVar21] * wa[iVar14 + lVar21];
                  pfVar13[lVar21] =
                       wa[(long)iVar14 + lVar21 + -1] * pfVar6[lVar21] +
                       wa[iVar14 + lVar21] * pfVar6[lVar21 + -1];
                  lVar21 = lVar21 + 2;
                } while ((int)lVar21 < ido);
              }
              iVar15 = iVar15 + 1;
              pfVar6 = pfVar6 + lVar4;
              pfVar13 = pfVar13 + lVar4;
            } while (iVar15 != l1);
          }
          iVar2 = iVar2 + 1;
          iVar14 = iVar14 + ido;
          iVar1 = iVar1 + iVar3;
        } while (iVar2 != ip);
      }
    }
    else if (1 < ip) {
      iVar1 = iVar3 + 2;
      iVar2 = 1;
      iVar14 = -1;
      do {
        if (2 < ido) {
          iVar10 = 2;
          lVar21 = (long)iVar14;
          iVar15 = iVar1;
          do {
            lVar16 = lVar21 + 2;
            if (0 < l1) {
              lVar18 = (long)iVar15 << 2;
              iVar12 = l1;
              do {
                *(float *)((long)c1 + lVar18 + -4) =
                     wa[lVar21 + 1] * *(float *)((long)ch + lVar18 + -4) -
                     *(float *)((long)ch + lVar18) * wa[lVar16];
                *(float *)((long)c1 + lVar18) =
                     wa[lVar21 + 1] * *(float *)((long)ch + lVar18) +
                     wa[lVar16] * *(float *)((long)ch + lVar18 + -4);
                lVar18 = lVar18 + lVar4 * 4;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            iVar10 = iVar10 + 2;
            iVar15 = iVar15 + 2;
            lVar21 = lVar16;
          } while (iVar10 < ido);
        }
        iVar2 = iVar2 + 1;
        iVar1 = iVar1 + iVar3;
        iVar14 = iVar14 + ido;
      } while (iVar2 != ip);
    }
  }
  return;
}

Assistant:

static void dradbg(int ido,int ip,int l1,int idl1,float *cc,float *c1,
            float *c2,float *ch,float *ch2,float *wa){
  static float tpi=6.283185307179586f;
  int idij,ipph,i,j,k,l,ik,is,t0,t1,t2,t3,t4,t5,t6,t7,t8,t9,t10,
      t11,t12;
  float dc2,ai1,ai2,ar1,ar2,ds2;
  int nbd;
  float dcp,arg,dsp,ar1h,ar2h;
  int ipp2;

  t10=ip*ido;
  t0=l1*ido;
  arg=tpi/(float)ip;
  dcp=cos(arg);
  dsp=sin(arg);
  nbd=(ido-1)>>1;
  ipp2=ip;
  ipph=(ip+1)>>1;
  if(ido<l1)goto L103;

  t1=0;
  t2=0;
  for(k=0;k<l1;k++){
    t3=t1;
    t4=t2;
    for(i=0;i<ido;i++){
      ch[t3]=cc[t4];
      t3++;
      t4++;
    }
    t1+=ido;
    t2+=t10;
  }
  goto L106;

 L103:
  t1=0;
  for(i=0;i<ido;i++){
    t2=t1;
    t3=t1;
    for(k=0;k<l1;k++){
      ch[t2]=cc[t3];
      t2+=ido;
      t3+=t10;
    }
    t1++;
  }

 L106:
  t1=0;
  t2=ipp2*t0;
  t7=(t5=ido<<1);
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    t6=t5;
    for(k=0;k<l1;k++){
      ch[t3]=cc[t6-1]+cc[t6-1];
      ch[t4]=cc[t6]+cc[t6];
      t3+=ido;
      t4+=ido;
      t6+=t10;
    }
    t5+=t7;
  }

  if (ido == 1)goto L116;
  if(nbd<l1)goto L112;

  t1=0;
  t2=ipp2*t0;
  t7=0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;

    t7+=(ido<<1);
    t8=t7;
    for(k=0;k<l1;k++){
      t5=t3;
      t6=t4;
      t9=t8;
      t11=t8;
      for(i=2;i<ido;i+=2){
        t5+=2;
        t6+=2;
        t9+=2;
        t11-=2;
        ch[t5-1]=cc[t9-1]+cc[t11-1];
        ch[t6-1]=cc[t9-1]-cc[t11-1];
        ch[t5]=cc[t9]-cc[t11];
        ch[t6]=cc[t9]+cc[t11];
      }
      t3+=ido;
      t4+=ido;
      t8+=t10;
    }
  }
  goto L116;

 L112:
  t1=0;
  t2=ipp2*t0;
  t7=0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    t7+=(ido<<1);
    t8=t7;
    t9=t7;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t8+=2;
      t9-=2;
      t5=t3;
      t6=t4;
      t11=t8;
      t12=t9;
      for(k=0;k<l1;k++){
        ch[t5-1]=cc[t11-1]+cc[t12-1];
        ch[t6-1]=cc[t11-1]-cc[t12-1];
        ch[t5]=cc[t11]-cc[t12];
        ch[t6]=cc[t11]+cc[t12];
        t5+=ido;
        t6+=ido;
        t11+=t10;
        t12+=t10;
      }
    }
  }

L116:
  ar1=1.f;
  ai1=0.f;
  t1=0;
  t9=(t2=ipp2*idl1);
  t3=(ip-1)*idl1;
  for(l=1;l<ipph;l++){
    t1+=idl1;
    t2-=idl1;

    ar1h=dcp*ar1-dsp*ai1;
    ai1=dcp*ai1+dsp*ar1;
    ar1=ar1h;
    t4=t1;
    t5=t2;
    t6=0;
    t7=idl1;
    t8=t3;
    for(ik=0;ik<idl1;ik++){
      c2[t4++]=ch2[t6++]+ar1*ch2[t7++];
      c2[t5++]=ai1*ch2[t8++];
    }
    dc2=ar1;
    ds2=ai1;
    ar2=ar1;
    ai2=ai1;

    t6=idl1;
    t7=t9-idl1;
    for(j=2;j<ipph;j++){
      t6+=idl1;
      t7-=idl1;
      ar2h=dc2*ar2-ds2*ai2;
      ai2=dc2*ai2+ds2*ar2;
      ar2=ar2h;
      t4=t1;
      t5=t2;
      t11=t6;
      t12=t7;
      for(ik=0;ik<idl1;ik++){
        c2[t4++]+=ar2*ch2[t11++];
        c2[t5++]+=ai2*ch2[t12++];
      }
    }
  }

  t1=0;
  for(j=1;j<ipph;j++){
    t1+=idl1;
    t2=t1;
    for(ik=0;ik<idl1;ik++)ch2[ik]+=ch2[t2++];
  }

  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(k=0;k<l1;k++){
      ch[t3]=c1[t3]-c1[t4];
      ch[t4]=c1[t3]+c1[t4];
      t3+=ido;
      t4+=ido;
    }
  }

  if(ido==1)goto L132;
  if(nbd<l1)goto L128;

  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(k=0;k<l1;k++){
      t5=t3;
      t6=t4;
      for(i=2;i<ido;i+=2){
        t5+=2;
        t6+=2;
        ch[t5-1]=c1[t5-1]-c1[t6];
        ch[t6-1]=c1[t5-1]+c1[t6];
        ch[t5]=c1[t5]+c1[t6-1];
        ch[t6]=c1[t5]-c1[t6-1];
      }
      t3+=ido;
      t4+=ido;
    }
  }
  goto L132;

 L128:
  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t5=t3;
      t6=t4;
      for(k=0;k<l1;k++){
        ch[t5-1]=c1[t5-1]-c1[t6];
        ch[t6-1]=c1[t5-1]+c1[t6];
        ch[t5]=c1[t5]+c1[t6-1];
        ch[t6]=c1[t5]-c1[t6-1];
        t5+=ido;
        t6+=ido;
      }
    }
  }

L132:
  if(ido==1)return;

  for(ik=0;ik<idl1;ik++)c2[ik]=ch2[ik];

  t1=0;
  for(j=1;j<ip;j++){
    t2=(t1+=t0);
    for(k=0;k<l1;k++){
      c1[t2]=ch[t2];
      t2+=ido;
    }
  }

  if(nbd>l1)goto L139;

  is= -ido-1;
  t1=0;
  for(j=1;j<ip;j++){
    is+=ido;
    t1+=t0;
    idij=is;
    t2=t1;
    for(i=2;i<ido;i+=2){
      t2+=2;
      idij+=2;
      t3=t2;
      for(k=0;k<l1;k++){
        c1[t3-1]=wa[idij-1]*ch[t3-1]-wa[idij]*ch[t3];
        c1[t3]=wa[idij-1]*ch[t3]+wa[idij]*ch[t3-1];
        t3+=ido;
      }
    }
  }
  return;

 L139:
  is= -ido-1;
  t1=0;
  for(j=1;j<ip;j++){
    is+=ido;
    t1+=t0;
    t2=t1;
    for(k=0;k<l1;k++){
      idij=is;
      t3=t2;
      for(i=2;i<ido;i+=2){
        idij+=2;
        t3+=2;
        c1[t3-1]=wa[idij-1]*ch[t3-1]-wa[idij]*ch[t3];
        c1[t3]=wa[idij-1]*ch[t3]+wa[idij]*ch[t3-1];
      }
      t2+=ido;
    }
  }
}